

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O1

GLFWmonitor * vera::getMonitorFromWindow(GLFWwindow *window)

{
  uint uVar1;
  GLFWmonitor **ppGVar2;
  GLFWvidmode *pGVar3;
  GLFWmonitor *pGVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int monitorCount;
  _rect windowRect;
  _rect monitorRect;
  int local_6c;
  undefined8 local_68;
  int iStack_60;
  int aiStack_5c [3];
  uint local_50;
  uint local_4c;
  int local_48;
  int local_44;
  uint local_40;
  uint local_3c;
  int local_38;
  int local_34;
  
  local_68 = 0;
  iStack_60 = 0;
  aiStack_5c[0] = 0;
  if (window == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/src/window.cpp"
                  ,0x81,"GLFWmonitor *vera::getMonitorFromWindow(GLFWwindow *)");
  }
  ppGVar2 = glfwGetMonitors(&local_6c);
  if (local_6c == 1) {
LAB_001fe293:
    pGVar4 = *ppGVar2;
  }
  else {
    if (1 < local_6c) {
      glfwGetWindowPos(window,(int *)&local_50,(int *)&local_4c);
      glfwGetWindowSize(window,&local_48,&local_44);
      glfwGetWindowFrameSize
                (window,(int *)&local_68,(int *)((long)&local_68 + 4),&iStack_60,aiStack_5c);
      local_50 = local_50 - (int)local_68;
      local_4c = local_4c - local_68._4_4_;
      local_48 = local_48 + (int)local_68 + iStack_60;
      local_44 = local_44 + local_68._4_4_ + aiStack_5c[0];
      if (local_6c < 1) {
        uVar5 = 0xffffffff;
      }
      else {
        uVar9 = 0;
        uVar6 = 0xffffffff;
        iVar10 = 0;
        iVar11 = 0;
        do {
          glfwGetMonitorPos(ppGVar2[uVar9],(int *)&local_40,(int *)&local_3c);
          pGVar3 = glfwGetVideoMode(ppGVar2[uVar9]);
          local_38 = pGVar3->width;
          local_34 = pGVar3->height;
          iStack_60 = local_38 + local_40;
          if ((((iStack_60 < (int)local_50) || (iVar7 = local_48 + local_50, iVar7 < (int)local_40))
              || (aiStack_5c[0] = local_34 + local_3c, aiStack_5c[0] < (int)local_4c)) ||
             (iVar8 = local_44 + local_4c, iVar8 < (int)local_3c)) {
            iStack_60 = 0;
            aiStack_5c[0] = 0;
            local_68 = 0;
            uVar5 = 0;
          }
          else {
            uVar5 = local_40;
            if ((int)local_40 < (int)local_50) {
              uVar5 = local_50;
            }
            if (iVar7 < iStack_60) {
              iStack_60 = iVar7;
            }
            iStack_60 = iStack_60 - uVar5;
            uVar1 = local_3c;
            if ((int)local_3c < (int)local_4c) {
              uVar1 = local_4c;
            }
            if (iVar8 < aiStack_5c[0]) {
              aiStack_5c[0] = iVar8;
            }
            aiStack_5c[0] = aiStack_5c[0] - uVar1;
            local_68 = (ulong)uVar1 << 0x20;
          }
          local_68 = local_68 | uVar5;
          if (aiStack_5c[0] * iStack_60 != 0 &&
              (uint)(iVar10 * iVar11) < (uint)(aiStack_5c[0] * iStack_60)) {
            uVar6 = uVar9 & 0xffffffff;
            iVar11 = iStack_60;
            iVar10 = aiStack_5c[0];
          }
          uVar5 = (uint)uVar6;
          uVar9 = uVar9 + 1;
        } while ((long)uVar9 < (long)local_6c);
      }
      if (-1 < (int)uVar5) {
        ppGVar2 = ppGVar2 + uVar5;
        goto LAB_001fe293;
      }
    }
    pGVar4 = (GLFWmonitor *)0x0;
  }
  return pGVar4;
}

Assistant:

GLFWAPI GLFWmonitor* getMonitorFromWindow(GLFWwindow* window) {  
    GLFWmonitor* result = NULL;

    int monitorCount;
    GLFWmonitor** monitors;
    const GLFWvidmode* vidmode;

    unsigned int currentDim, overlapDim;
    int overlapMonitor, i;

    _rect windowRect;
    _rect monitorRect;
    _rect scratchRect = { 0, 0, 0, 0 };
    _rect overlapRect = { 0, 0, 0, 0 };

    assert(window != NULL);

    // _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    monitors = glfwGetMonitors(&monitorCount);

    if (monitorCount == 1)
        result = monitors[0];

    else if (monitorCount > 1) {
        glfwGetWindowPos(window, &windowRect.x, &windowRect.y);
        glfwGetWindowSize(window, &windowRect.w, &windowRect.h);

        glfwGetWindowFrameSize(window, &scratchRect.x, &scratchRect.y, 
        &scratchRect.w, &scratchRect.h);

        windowRect.x -= scratchRect.x;
        windowRect.y -= scratchRect.y;
        windowRect.w += scratchRect.x + scratchRect.w;
        windowRect.h += scratchRect.y + scratchRect.h;

        overlapMonitor = -1;

        for (i = 0; i < monitorCount; i++) {
            glfwGetMonitorPos(monitors[i], &monitorRect.x, &monitorRect.y);

            vidmode = glfwGetVideoMode(monitors[i]);
            monitorRect.w = vidmode->width;
            monitorRect.h = vidmode->height;

            scratchRect = _get_intersection(&windowRect, &monitorRect);

            currentDim = scratchRect.w * scratchRect.h;
            overlapDim = overlapRect.w * overlapRect.h;

            if (currentDim > 0 && currentDim > overlapDim) {
                overlapRect = scratchRect;
                overlapMonitor = i;
            }
        }

        if (overlapMonitor >= 0)
        result = monitors[overlapMonitor];
    }

    return result;
}